

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

void uv__queue_done(uv__work *w,int err)

{
  int iVar1;
  uv__queue *UNRECOVERED_JUMPTABLE;
  undefined4 in_register_00000034;
  
  iVar1 = *(int *)(w[-2].work + 0x20);
  if (iVar1 == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/threadpool.c"
                  ,0x152,"void uv__queue_done(struct uv__work *, int)");
  }
  *(int *)(w[-2].work + 0x20) = iVar1 + -1;
  UNRECOVERED_JUMPTABLE = w[-1].wq.prev;
  if (UNRECOVERED_JUMPTABLE != (uv__queue *)0x0) {
    (*(code *)UNRECOVERED_JUMPTABLE)(&w[-3].wq.prev,CONCAT44(in_register_00000034,err));
    return;
  }
  return;
}

Assistant:

static void uv__queue_done(struct uv__work* w, int err) {
  uv_work_t* req;

  req = container_of(w, uv_work_t, work_req);
  uv__req_unregister(req->loop, req);

  if (req->after_work_cb == NULL)
    return;

  req->after_work_cb(req, err);
}